

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objfile.c
# Opt level: O3

block_header_t * read_block_header(void)

{
  block_type_t bVar1;
  int iVar2;
  block_header_t *pbVar3;
  
  pbVar3 = (block_header_t *)mmalloc(8);
  bVar1 = read_int32();
  pbVar3->type = bVar1;
  iVar2 = read_int32();
  pbVar3->num_entries = iVar2;
  if (relocations < pbVar3->type) {
    err(F,"invalid object file: unknown block type");
  }
  return pbVar3;
}

Assistant:

block_header_t* read_block_header()
{
    block_header_t* header = (block_header_t*)mmalloc(sizeof(block_header_t));
    header->type = read_int32();
    header->num_entries = read_int32();
    if (header->type < sections || header->type > relocations)
        err(F, "invalid object file: unknown block type");
    return header;
}